

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O0

bool CEditor::PopupSelectDoodadRuleSet(void *pContext,CUIRect View)

{
  long lVar1;
  int iVar2;
  CLayer *pText;
  CEditorImage **ppCVar3;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  char *in_XMM1_Qa;
  int i;
  IAutoMapper *pMapper;
  CLayerTiles *pLayer;
  CEditor *pEditor;
  CUIRect Button;
  CUIRect *in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff94;
  CEditor *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar4;
  uint uVar5;
  IAutoMapper *pIVar6;
  CEditor *this;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  pText = GetSelectedLayer((CEditor *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  ppCVar3 = array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::operator[]
                      (&(in_RDI->m_Map).m_lImages,*(int *)&pText[1].m_pEditor);
  pIVar6 = (*ppCVar3)->m_pAutoMapper;
  uVar4 = 0;
  do {
    uVar5 = uVar4;
    iVar2 = (*pIVar6->_vptr_IAutoMapper[5])();
    if (iVar2 <= (int)uVar4) {
      local_29 = false;
LAB_002160e1:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_29;
      }
      __stack_chk_fail();
    }
    CUIRect::HSplitTop((CUIRect *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                       in_stack_ffffffffffffff88,(CUIRect *)0x216040);
    CUIRect::HSplitTop((CUIRect *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                       in_stack_ffffffffffffff88,(CUIRect *)0x21605a);
    in_stack_ffffffffffffff98 = in_RDI;
    iVar2 = (int)((ulong)(PopupSelectDoodadRuleSet::s_AutoMapperDoodadButtons + (int)uVar5) >> 0x20)
    ;
    in_RDI = in_stack_ffffffffffffff98;
    (*pIVar6->_vptr_IAutoMapper[6])(pIVar6,(ulong)uVar5);
    in_stack_ffffffffffffff88 = (CUIRect *)0x0;
    iVar2 = DoButton_Editor(this,in_RDI,(char *)pText,(int)((ulong)pIVar6 >> 0x20),
                            (CUIRect *)CONCAT44(uVar5,uVar4),iVar2,in_XMM1_Qa);
    if (iVar2 != 0) {
      pText[2].m_Flags = uVar5;
      local_29 = true;
      goto LAB_002160e1;
    }
    uVar4 = uVar5 + 1;
  } while( true );
}

Assistant:

bool CEditor::PopupSelectDoodadRuleSet(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CLayerTiles *pLayer = static_cast<CLayerTiles*>(pEditor->GetSelectedLayer(0));
	CUIRect Button;
	static int s_AutoMapperDoodadButtons[IAutoMapper::MAX_RULES];
	IAutoMapper *pMapper = pEditor->m_Map.m_lImages[pLayer->m_Image]->m_pAutoMapper;

	for(int i = 0; i < pMapper->RuleSetNum(); ++i)
	{
		View.HSplitTop(2.0f, 0, &View);
		View.HSplitTop(12.0f, &Button, &View);
		if(pEditor->DoButton_Editor(&s_AutoMapperDoodadButtons[i], pMapper->GetRuleSetName(i), 0, &Button, 0, 0))
		{
			pLayer->m_SelectedRuleSet = i;
			return true; // close the popup
		}
	}

	return false;
}